

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong *puVar19;
  ulong *puVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  ulong *local_d8;
  ulong local_b8;
  
  if (bmi2 != 0) {
    sVar6 = ZSTD_encodeSequences_bmi2
                      (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,ofCodeTable,
                       CTable_LitLength,llCodeTable,sequences,nbSeq,longOffsets);
    return sVar6;
  }
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar2 = (ushort)*CTable_MatchLength;
  uVar17 = (ulong)mlCodeTable[nbSeq - 1];
  lVar7 = (long)(1 << ((char)uVar2 - 1U & 0x1f));
  if (uVar2 == 0) {
    lVar7 = 1;
  }
  uVar27 = CTable_MatchLength[lVar7 + uVar17 * 2 + 2] + 0x8000;
  uVar3 = (ushort)*CTable_OffsetBits;
  bVar1 = ofCodeTable[nbSeq - 1];
  uVar11 = (ulong)bVar1;
  lVar12 = (long)(1 << ((char)uVar3 - 1U & 0x1f));
  if (uVar3 == 0) {
    lVar12 = 1;
  }
  uVar25 = CTable_OffsetBits[lVar12 + uVar11 * 2 + 2] + 0x8000;
  local_b8 = (ulong)*(ushort *)
                     ((long)CTable_MatchLength +
                     (long)(int)CTable_MatchLength[lVar7 + uVar17 * 2 + 1] * 2 +
                     (ulong)((uVar27 & 0xffff0000) - CTable_MatchLength[lVar7 + uVar17 * 2 + 2] >>
                            ((byte)(uVar27 >> 0x10) & 0x3f)) * 2 + 4);
  uVar15 = (ulong)*(ushort *)
                   ((long)CTable_OffsetBits +
                   (long)(int)CTable_OffsetBits[lVar12 + uVar11 * 2 + 1] * 2 +
                   (ulong)((uVar25 & 0xffff0000) - CTable_OffsetBits[lVar12 + uVar11 * 2 + 2] >>
                          ((byte)(uVar25 >> 0x10) & 0x3f)) * 2 + 4);
  uVar4 = (ushort)*CTable_LitLength;
  lVar13 = (long)(1 << ((char)uVar4 - 1U & 0x1f));
  if (uVar4 == 0) {
    lVar13 = 1;
  }
  uVar8 = (ulong)llCodeTable[nbSeq - 1];
  uVar27 = CTable_LitLength[lVar13 + uVar8 * 2 + 2] + 0x8000;
  uVar5 = *(ushort *)
           ((long)CTable_LitLength +
           (long)(int)CTable_LitLength[lVar13 + uVar8 * 2 + 1] * 2 +
           (ulong)((uVar27 & 0xffff0000) - CTable_LitLength[lVar13 + uVar8 * 2 + 2] >>
                  ((byte)(uVar27 >> 0x10) & 0x3f)) * 2 + 4);
  uVar27 = LL_bits[uVar8];
  iVar22 = ML_bits[uVar17] + uVar27;
  uVar17 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar17]]) <<
           ((byte)uVar27 & 0x3f) | (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar27]);
  puVar20 = (ulong *)((long)dst + (dstCapacity - 8));
  if ((longOffsets == 0) || (bVar1 < 0x38)) {
    if (bVar1 < 0x20) {
      uVar27 = iVar22 + (uint)bVar1;
      if (0x3f < uVar27) goto LAB_00112f7b;
      if (puVar20 < dst) goto LAB_00112f5c;
      uVar17 = (ulong)(sequences[nbSeq - 1].offset & BIT_mask[uVar11]) << ((byte)iVar22 & 0x3f) |
               uVar17;
      puVar18 = (ulong *)((ulong)(uVar27 >> 3) + (long)dst);
      if (puVar20 < puVar18) {
        puVar18 = puVar20;
      }
      *(ulong *)dst = uVar17;
      uVar17 = uVar17 >> ((byte)uVar27 & 0x38);
      uVar27 = uVar27 & 7;
      if (1 < nbSeq) {
        uVar11 = nbSeq - 2;
        do {
          bVar1 = ofCodeTable[uVar11];
          uVar14 = (ulong)bVar1;
          uVar8 = CTable_OffsetBits[lVar12 + uVar14 * 2 + 2] + uVar15;
          if (0x1fffff < uVar8) goto LAB_00112fba;
          uVar25 = uVar27 + (int)(uVar8 >> 0x10);
          if (0x3f < uVar25) goto LAB_00112f7b;
          uVar28 = (uint)uVar15;
          uVar21 = (ulong)mlCodeTable[uVar11];
          uVar9 = CTable_MatchLength[lVar7 + uVar21 * 2 + 2] + local_b8;
          if (0x1fffff < uVar9) goto LAB_00112fba;
          uVar23 = uVar25 + (int)(uVar9 >> 0x10);
          if (0x3f < uVar23) goto LAB_00112f7b;
          uVar24 = (uint)local_b8;
          uVar10 = (ulong)llCodeTable[uVar11];
          uVar26 = (ulong)CTable_LitLength[lVar13 + uVar10 * 2 + 2] + (ulong)uVar5;
          if (0x1fffff < uVar26) goto LAB_00112fba;
          uVar16 = uVar23 + (int)(uVar26 >> 0x10);
          if (0x3f < uVar16) goto LAB_00112f7b;
          uVar15 = (ulong)*(ushort *)
                           ((long)CTable_OffsetBits +
                           (long)(int)CTable_OffsetBits[lVar12 + uVar14 * 2 + 1] * 2 +
                           (uVar15 >> ((byte)(uVar8 >> 0x10) & 0x3f)) * 2 + 4);
          local_b8 = (ulong)*(ushort *)
                             ((long)CTable_MatchLength +
                             (long)(int)CTable_MatchLength[lVar7 + uVar21 * 2 + 1] * 2 +
                             (local_b8 >> ((byte)(uVar9 >> 0x10) & 0x3f)) * 2 + 4);
          uVar17 = (ulong)(BIT_mask[uVar8 >> 0x10] & uVar28) << (sbyte)uVar27 | uVar17 |
                   (ulong)(BIT_mask[uVar9 >> 0x10] & uVar24) << ((byte)uVar25 & 0x3f) |
                   (ulong)(BIT_mask[uVar26 >> 0x10] & (uint)uVar5) << ((byte)uVar23 & 0x3f);
          uVar27 = LL_bits[uVar10];
          uVar25 = ML_bits[uVar21];
          uVar5 = *(ushort *)
                   ((long)CTable_LitLength +
                   (long)(int)CTable_LitLength[lVar13 + uVar10 * 2 + 1] * 2 +
                   (ulong)(uVar5 >> ((byte)(uVar26 >> 0x10) & 0x3f)) * 2 + 4);
          uVar28 = uVar27 + bVar1 + uVar25;
          local_d8 = puVar18;
          if (0x1e < uVar28) {
            local_d8 = (ulong *)((ulong)(uVar16 >> 3) + (long)puVar18);
            if (puVar20 < local_d8) {
              local_d8 = puVar20;
            }
            *puVar18 = uVar17;
            uVar17 = uVar17 >> ((byte)uVar16 & 0x38);
            uVar16 = uVar16 & 7;
          }
          uVar23 = uVar27 + uVar16;
          if ((0x3f < uVar23) || (uVar24 = uVar23 + uVar25, 0x3f < uVar24)) goto LAB_00112f7b;
          uVar17 = (ulong)((uint)sequences[uVar11].matchLength & BIT_mask[uVar25]) <<
                   ((byte)uVar23 & 0x3f) |
                   (ulong)((uint)sequences[uVar11].litLength & BIT_mask[uVar27]) <<
                   ((byte)uVar16 & 0x3f) | uVar17;
          if (0x38 < uVar28) {
            puVar18 = (ulong *)((ulong)(uVar24 >> 3) + (long)local_d8);
            if (puVar20 < puVar18) {
              puVar18 = puVar20;
            }
            *local_d8 = uVar17;
            uVar17 = uVar17 >> ((byte)uVar24 & 0x38);
            uVar24 = uVar24 & 7;
            local_d8 = puVar18;
          }
          uVar27 = (uint)bVar1;
          if ((longOffsets != 0) && (0x37 < bVar1)) {
            if ((uVar27 == 0x38) || (uVar27 = uVar27 - 0x38, 0x1f < uVar27)) goto LAB_00112fba;
            if (0x3f < uVar24 + uVar27) goto LAB_00112f7b;
            *local_d8 = (ulong)(sequences[uVar11].offset & BIT_mask[uVar27]) <<
                        ((byte)uVar24 & 0x3f) | uVar17;
            goto LAB_00112fba;
          }
          if (0x1f < bVar1) goto LAB_00112fba;
          uVar27 = uVar24 + uVar27;
          if (0x3f < uVar27) goto LAB_00112f7b;
          uVar17 = (ulong)(BIT_mask[uVar14] & sequences[uVar11].offset) << ((byte)uVar24 & 0x3f) |
                   uVar17;
          puVar18 = (ulong *)((ulong)(uVar27 >> 3) + (long)local_d8);
          if (puVar20 < puVar18) {
            puVar18 = puVar20;
          }
          *local_d8 = uVar17;
          uVar17 = uVar17 >> ((byte)uVar27 & 0x38);
          uVar11 = uVar11 - 1;
          uVar27 = uVar27 & 7;
        } while (uVar11 < nbSeq);
      }
      if (uVar2 < 0x20) {
        uVar17 = (ulong)((uint)local_b8 & BIT_mask[uVar2]) << (sbyte)uVar27 | uVar17;
        *puVar18 = uVar17;
        if (uVar3 < 0x20) {
          uVar27 = uVar27 + uVar2;
          puVar18 = (ulong *)((long)puVar18 + (ulong)(uVar27 >> 3));
          if (puVar20 < puVar18) {
            puVar18 = puVar20;
          }
          uVar17 = (ulong)((uint)uVar15 & BIT_mask[uVar3]) << (sbyte)(uVar27 & 7) |
                   uVar17 >> ((byte)uVar27 & 0x38);
          *puVar18 = uVar17;
          if (uVar4 < 0x20) {
            uVar27 = (uVar27 & 7) + (uint)uVar3;
            puVar18 = (ulong *)((long)puVar18 + (ulong)(uVar27 >> 3));
            if (puVar20 < puVar18) {
              puVar18 = puVar20;
            }
            uVar25 = (uVar27 & 7) + (uint)uVar4;
            uVar17 = (ulong)((uint)uVar5 & BIT_mask[uVar4]) << (sbyte)(uVar27 & 7) |
                     uVar17 >> ((byte)uVar27 & 0x38);
            puVar19 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar18);
            if (puVar20 < puVar19) {
              puVar19 = puVar20;
            }
            *puVar18 = uVar17;
            uVar27 = (uVar25 & 7) + 1;
            *puVar19 = uVar17 >> ((byte)uVar25 & 0x38) | 1L << (uVar25 & 7);
            puVar19 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar19);
            if (puVar20 < puVar19) {
              puVar19 = puVar20;
            }
            if ((puVar19 < puVar20) &&
               (sVar6 = (long)puVar19 + ((ulong)((uVar27 & 7) != 0) - (long)dst), sVar6 != 0)) {
              return sVar6;
            }
            return 0xffffffffffffffba;
          }
        }
      }
    }
  }
  else if ((bVar1 != 0x38) && (uVar27 = bVar1 - 0x38, uVar27 < 0x20)) {
    if (0x3f < iVar22 + uVar27) {
LAB_00112f7b:
      __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5df,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
    }
    if (puVar20 < dst) {
LAB_00112f5c:
      __assert_fail("bitC->ptr <= bitC->endPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
    }
    *(ulong *)dst =
         (ulong)(sequences[nbSeq - 1].offset & BIT_mask[uVar27]) << ((byte)iVar22 & 0x3f) | uVar17;
  }
LAB_00112fba:
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5de,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}